

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.h
# Opt level: O2

void __thiscall
flow::PassManager::logDebug<std::__cxx11::string>
          (PassManager *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string_view format_str;
  string sStack_38;
  
  this_00 = &sStack_38;
  pcVar1 = (char *)strlen(msg);
  format_str.size_ = (size_t)args;
  format_str.data_ = pcVar1;
  fmt::v5::format<std::__cxx11::string>(&sStack_38,(v5 *)msg,format_str,in_R8);
  logDebug((PassManager *)this_00,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void logDebug(const char* msg, Args... args) {
    logDebug(fmt::format(msg, args...));
  }